

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O3

void __thiscall
prometheus::detail::MetricsHandler::RemoveCollectable
          (MetricsHandler *this,weak_ptr<prometheus::Collectable> *collectable)

{
  mutex *__mutex;
  int iVar1;
  __weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pthread_mutex_t *__mutex_00;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  __first;
  __normal_iterator<std::weak_ptr<prometheus::Collectable>_*,_std::vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>_>
  _Var6;
  long unaff_R15;
  long lVar7;
  bool bVar8;
  shared_ptr<prometheus::Collectable> locked;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  pthread_mutex_t *local_40;
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  *local_38;
  
  __mutex = &this->collectables_mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar4 = std::__throw_system_error(iVar3);
    if (unaff_R15 != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    }
    pthread_mutex_unlock(local_40);
    _Unwind_Resume(uVar4);
  }
  local_60 = (collectable->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  local_48 = local_60;
  if (local_60 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0012974a:
    local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50 = (element_type *)0x0;
  }
  else {
    iVar3 = local_60->_M_use_count;
    do {
      if (iVar3 == 0) {
        local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0012974a;
      }
      LOCK();
      iVar1 = local_60->_M_use_count;
      bVar8 = iVar3 == iVar1;
      if (bVar8) {
        local_60->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar8);
    if (local_60 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0012974a;
    if (local_60->_M_use_count == 0) {
      local_50 = (element_type *)0x0;
    }
    else {
      local_50 = (collectable->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    }
  }
  local_38 = &this->collectables_;
  _Var6._M_current =
       (this->collectables_).
       super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = &((this->collectables_).
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>;
  lVar7 = (long)p_Var2 - (long)_Var6._M_current;
  local_40 = (pthread_mutex_t *)__mutex;
  if (0 < lVar7 >> 6) {
    lVar5 = (lVar7 >> 6) + 1;
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_50,_Var6);
      __first._M_current = _Var6._M_current;
      if (bVar8) goto LAB_00129872;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_50,_Var6._M_current + 1);
      __first._M_current = _Var6._M_current + 1;
      if (bVar8) goto LAB_00129872;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_50,_Var6._M_current + 2);
      __first._M_current = _Var6._M_current + 2;
      if (bVar8) goto LAB_00129872;
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_50,_Var6._M_current + 3);
      __first._M_current = _Var6._M_current + 3;
      if (bVar8) goto LAB_00129872;
      _Var6._M_current = _Var6._M_current + 4;
      lVar5 = lVar5 + -1;
      lVar7 = lVar7 + -0x40;
    } while (1 < lVar5);
  }
  lVar7 = lVar7 >> 4;
  if (lVar7 == 1) {
LAB_0012985c:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_50,_Var6);
    __first._M_current = _Var6._M_current;
    if (!bVar8) {
      __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var2;
    }
  }
  else if (lVar7 == 2) {
LAB_0012983b:
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_50,_Var6);
    __first._M_current = _Var6._M_current;
    if (!bVar8) {
      _Var6._M_current = _Var6._M_current + 1;
      goto LAB_0012985c;
    }
  }
  else {
    __first._M_current = (weak_ptr<prometheus::Collectable> *)p_Var2;
    if (lVar7 != 3) goto LAB_001298c1;
    bVar8 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
            ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                          *)&local_50,_Var6);
    __first._M_current = _Var6._M_current;
    if (!bVar8) {
      _Var6._M_current = _Var6._M_current + 1;
      goto LAB_0012983b;
    }
  }
LAB_00129872:
  _Var6._M_current =
       (weak_ptr<prometheus::Collectable> *)
       (&(__first._M_current)->super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>
       + 1);
  if ((__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> *)_Var6._M_current != p_Var2
      && &(__first._M_current)->
          super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> != p_Var2) {
    do {
      bVar8 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::$_0>
              ::operator()((_Iter_pred<prometheus::detail::MetricsHandler::RemoveCollectable(std::weak_ptr<prometheus::Collectable>const&)::__0>
                            *)&local_50,_Var6);
      if (!bVar8) {
        std::__weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>,
                   &(_Var6._M_current)->
                    super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2>);
        __first._M_current =
             (weak_ptr<prometheus::Collectable> *)
             (&(__first._M_current)->
               super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> + 1);
      }
      _Var6._M_current = _Var6._M_current + 1;
    } while (&(_Var6._M_current)->
              super___weak_ptr<prometheus::Collectable,_(__gnu_cxx::_Lock_policy)2> != p_Var2);
  }
LAB_001298c1:
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::_M_erase(local_38,(iterator)__first._M_current,
             (this->collectables_).
             super__Vector_base<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __mutex_00 = local_40;
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  pthread_mutex_unlock(__mutex_00);
  return;
}

Assistant:

void MetricsHandler::RemoveCollectable(
    const std::weak_ptr<Collectable>& collectable) {
  std::lock_guard<std::mutex> lock{collectables_mutex_};

  auto locked = collectable.lock();
  auto same_pointer = [&locked](const std::weak_ptr<Collectable>& candidate) {
    return locked == candidate.lock();
  };

  collectables_.erase(std::remove_if(std::begin(collectables_),
                                     std::end(collectables_), same_pointer),
                      std::end(collectables_));
}